

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

void __thiscall
helics::FilterFederate::processFilterInfo(FilterFederate *this,ActionMessage *command)

{
  pointer *pppFVar1;
  byte *pbVar2;
  GlobalBrokerId GVar3;
  InterfaceHandle handle;
  pointer ppFVar4;
  pointer ppFVar5;
  FilterInfo *pFVar6;
  byte *pbVar7;
  iterator iVar8;
  size_t size;
  string_view type_in;
  string_view type_in_00;
  string_view type_out;
  string_view type_out_00;
  bool bVar9;
  _Head_base<0UL,_helics::FilterInfo_*,_false> __src;
  undefined8 uVar10;
  FilterCoordinator *pFVar11;
  const_iterator cVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  string *psVar14;
  BasicHandleInfo *pBVar15;
  pointer ppFVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  bool bVar18;
  bool bVar19;
  string_view key;
  string_view key_00;
  FilterInfo *newFilter;
  _Head_base<0UL,_helics::FilterInfo_*,_false> local_170;
  size_t local_168;
  size_type local_160;
  undefined8 uStack_158;
  InterfaceHandle local_14c;
  size_t local_148;
  char *pcStack_140;
  size_t local_138;
  char *pcStack_130;
  size_t local_128;
  char *pcStack_120;
  size_t local_118;
  char *pcStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ActionMessage local_e8;
  
  pFVar11 = getFilterCoordinator(this,(InterfaceHandle)(command->dest_handle).hid);
  if (pFVar11 == (FilterCoordinator *)0x0) {
    return;
  }
  if ((command->flags & 2) == 0) {
    ppFVar4 = (pFVar11->allSourceFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar5 = (pFVar11->allSourceFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar4 != ppFVar5) {
      bVar18 = false;
      do {
        ppFVar16 = ppFVar4 + 1;
        if (((*ppFVar4)->core_id).gid == (command->source_id).gid) {
          bVar9 = true;
          bVar19 = true;
          if (((*ppFVar4)->handle).hid != (command->source_handle).hid) goto LAB_00314ede;
        }
        else {
LAB_00314ede:
          bVar9 = false;
          bVar19 = bVar18;
        }
      } while ((!bVar9) && (ppFVar4 = ppFVar16, bVar18 = bVar19, ppFVar16 != ppFVar5));
      if (bVar19) {
        return;
      }
    }
    local_e8.messageAction = (command->source_id).gid;
    local_e8.messageID = (command->source_handle).hid;
    cVar12 = std::
             _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->filters).lookup._M_h,(key_type *)&local_e8);
    if (cVar12.
        super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
        _M_cur == (__node_type *)0x0) {
      local_170._M_head_impl = (FilterInfo *)0x0;
    }
    else {
      local_170._M_head_impl =
           *(FilterInfo **)
            &(this->filters).dataStorage.
             super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [*(long *)((long)cVar12.
                              super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                              ._M_cur + 0x10)]._M_t.
             super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>;
    }
    if ((_Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>)
        local_170._M_head_impl == (FilterInfo *)0x0) {
      GVar3.gid = (command->source_id).gid;
      handle.hid = (command->source_handle).hid;
      pbVar7 = (command->payload).heap;
      local_e8._0_8_ = &local_e8.dest_id;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,pbVar7,pbVar7 + (command->payload).bufferSize);
      uVar10 = local_e8._0_8_;
      psVar14 = ActionMessage::getString_abi_cxx11_(command,0);
      pcStack_130 = (psVar14->_M_dataplus)._M_p;
      local_138 = psVar14->_M_string_length;
      psVar14 = ActionMessage::getString_abi_cxx11_(command,1);
      pcStack_140 = (psVar14->_M_dataplus)._M_p;
      local_148 = psVar14->_M_string_length;
      type_in._M_str = pcStack_130;
      type_in._M_len = local_138;
      type_out._M_str = pcStack_140;
      type_out._M_len = local_148;
      key._M_str = (char *)uVar10;
      key._M_len._0_4_ = local_e8.source_id.gid;
      key._M_len._4_4_ = local_e8.source_handle.hid;
      local_170._M_head_impl =
           createFilter(this,GVar3,handle,key,type_in,type_out,
                        (bool)((byte)(command->flags >> 9) & 1));
      if ((GlobalFederateId *)local_e8._0_8_ != &local_e8.dest_id) {
        operator_delete((void *)local_e8._0_8_,
                        CONCAT44(local_e8.dest_handle.hid,local_e8.dest_id.gid) + 1);
      }
    }
    iVar8._M_current =
         (pFVar11->allSourceFilters).
         super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (pFVar11->allSourceFilters).
        super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<helics::FilterInfo*,std::allocator<helics::FilterInfo*>>::
      _M_realloc_insert<helics::FilterInfo*const&>
                ((vector<helics::FilterInfo*,std::allocator<helics::FilterInfo*>> *)
                 &pFVar11->allSourceFilters,iVar8,(FilterInfo **)&local_170);
    }
    else {
      *iVar8._M_current = local_170._M_head_impl;
      pppFVar1 = &(pFVar11->allSourceFilters).
                  super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    pFVar11->hasSourceFilters = true;
    pBVar15 = HandleManager::getInterfaceHandle
                        (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,ENDPOINT);
    if (pBVar15 == (BasicHandleInfo *)0x0) {
      return;
    }
    pbVar2 = (byte *)((long)&pBVar15->flags + 1);
    *pbVar2 = *pbVar2 | 8;
    return;
  }
  if ((command->flags >> 9 & 1) == 0) {
    pFVar6 = pFVar11->destFilter;
    if ((pFVar6 == (FilterInfo *)0x0) || ((pFVar6->core_id).gid != (command->source_id).gid))
    goto LAB_00314fb3;
    bVar19 = (pFVar6->handle).hid == (command->source_handle).hid;
  }
  else {
    ppFVar4 = (pFVar11->cloningDestFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar5 = (pFVar11->cloningDestFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar4 == ppFVar5) goto LAB_00314fb3;
    bVar18 = false;
    do {
      ppFVar16 = ppFVar4 + 1;
      if (((*ppFVar4)->core_id).gid == (command->source_id).gid) {
        bVar9 = true;
        bVar19 = true;
        if (((*ppFVar4)->handle).hid != (command->source_handle).hid) goto LAB_00314f8f;
      }
      else {
LAB_00314f8f:
        bVar9 = false;
        bVar19 = bVar18;
      }
    } while ((!bVar9) && (ppFVar4 = ppFVar16, bVar18 = bVar19, ppFVar16 != ppFVar5));
  }
  if (bVar19) {
    return;
  }
LAB_00314fb3:
  pBVar15 = HandleManager::getInterfaceHandle
                      (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,ENDPOINT);
  if (((pBVar15 == (BasicHandleInfo *)0x0) ||
      (pbVar2 = (byte *)((long)&pBVar15->flags + 1), *pbVar2 = *pbVar2 | 0x20,
      (command->flags & 0x200) != 0)) || (pFVar11->hasDestFilters != true)) {
    local_e8.messageAction = (command->source_id).gid;
    local_e8.messageID = (command->source_handle).hid;
    cVar12 = std::
             _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->filters).lookup._M_h,(key_type *)&local_e8);
    if (cVar12.
        super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
        _M_cur == (__node_type *)0x0) {
      local_170._M_head_impl = (FilterInfo *)0x0;
    }
    else {
      local_170._M_head_impl =
           *(FilterInfo **)
            &(this->filters).dataStorage.
             super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [*(long *)((long)cVar12.
                              super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                              ._M_cur + 0x10)]._M_t.
             super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>;
    }
    if ((_Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>)
        local_170._M_head_impl == (FilterInfo *)0x0) {
      GVar3.gid = (command->source_id).gid;
      local_14c.hid = (command->source_handle).hid;
      pbVar7 = (command->payload).heap;
      local_e8._0_8_ = &local_e8.dest_id;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,pbVar7,pbVar7 + (command->payload).bufferSize);
      uVar10 = local_e8._0_8_;
      psVar14 = ActionMessage::getString_abi_cxx11_(command,0);
      pcStack_110 = (psVar14->_M_dataplus)._M_p;
      local_118 = psVar14->_M_string_length;
      psVar14 = ActionMessage::getString_abi_cxx11_(command,1);
      pcStack_120 = (psVar14->_M_dataplus)._M_p;
      local_128 = psVar14->_M_string_length;
      type_in_00._M_str = pcStack_110;
      type_in_00._M_len = local_118;
      type_out_00._M_str = pcStack_120;
      type_out_00._M_len = local_128;
      key_00._M_str = (char *)uVar10;
      key_00._M_len._0_4_ = local_e8.source_id.gid;
      key_00._M_len._4_4_ = local_e8.source_handle.hid;
      local_170._M_head_impl =
           createFilter(this,GVar3,local_14c,key_00,type_in_00,type_out_00,
                        (bool)((byte)(command->flags >> 9) & 1));
      if ((GlobalFederateId *)local_e8._0_8_ != &local_e8.dest_id) {
        operator_delete((void *)local_e8._0_8_,
                        CONCAT44(local_e8.dest_handle.hid,local_e8.dest_id.gid) + 1);
      }
    }
    pFVar11->hasDestFilters = true;
    if ((command->flags & 0x200) == 0) {
      if (pBVar15 != (BasicHandleInfo *)0x0) {
        pbVar2 = (byte *)((long)&pBVar15->flags + 1);
        *pbVar2 = *pbVar2 | 0x40;
      }
      pFVar11->destFilter = local_170._M_head_impl;
    }
    else {
      iVar8._M_current =
           (pFVar11->cloningDestFilters).
           super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (pFVar11->cloningDestFilters).
          super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<helics::FilterInfo*,std::allocator<helics::FilterInfo*>>::
        _M_realloc_insert<helics::FilterInfo*const&>
                  ((vector<helics::FilterInfo*,std::allocator<helics::FilterInfo*>> *)
                   &pFVar11->cloningDestFilters,iVar8,(FilterInfo **)&local_170);
      }
      else {
        *iVar8._M_current = local_170._M_head_impl;
        pppFVar1 = &(pFVar11->cloningDestFilters).
                    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
    }
  }
  else {
    ActionMessage::ActionMessage(&local_e8,cmd_error);
    local_e8.dest_id.gid = (command->source_id).gid;
    local_e8.source_id.gid = (command->dest_id).gid;
    local_e8.source_handle.hid = (command->dest_handle).hid;
    local_e8.messageID = -1;
    std::operator+(&local_108,"Endpoint ",&pBVar15->key);
    pbVar13 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_108," already has a destination filter");
    local_170._M_head_impl = (FilterInfo *)(pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if (local_170._M_head_impl == (FilterInfo *)paVar17) {
      local_160 = paVar17->_M_allocated_capacity;
      uStack_158 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_170._M_head_impl = (FilterInfo *)&local_160;
    }
    else {
      local_160 = paVar17->_M_allocated_capacity;
    }
    __src._M_head_impl = local_170._M_head_impl;
    size = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    local_168 = size;
    local_e8.payload.bufferSize = size;
    if ((local_170._M_head_impl != (FilterInfo *)local_e8.payload.heap) &&
       (SmallBuffer::reserve(&local_e8.payload,size), size != 0)) {
      memcpy(local_e8.payload.heap,__src._M_head_impl,size);
    }
    if (local_170._M_head_impl != (FilterInfo *)&local_160) {
      operator_delete(local_170._M_head_impl,local_160 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((this->mSendMessageMove).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->mSendMessageMove)._M_invoker)((_Any_data *)&this->mSendMessageMove,&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
  }
  return;
}

Assistant:

void FilterFederate::processFilterInfo(ActionMessage& command)
{
    auto* filterC = getFilterCoordinator(command.dest_handle);
    if (filterC == nullptr) {
        return;
    }
    bool FilterAlreadyPresent = false;
    if (checkActionFlag(command, destination_target)) {
        if (checkActionFlag(command, clone_flag)) {
            for (auto& filt : filterC->cloningDestFilters) {
                if ((filt->core_id == command.source_id) &&
                    (filt->handle == command.source_handle)) {
                    FilterAlreadyPresent = true;
                    break;
                }
            }
        } else {  // there can only be one non-cloning destination filter
            if (filterC->destFilter != nullptr) {
                if ((filterC->destFilter->core_id == command.source_id) &&
                    (filterC->destFilter->handle == command.source_handle)) {
                    FilterAlreadyPresent = true;
                }
            }
        }

        if (!FilterAlreadyPresent) {
            auto* endhandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
            if (endhandle != nullptr) {
                setActionFlag(*endhandle, has_dest_filter_flag);
                if ((!checkActionFlag(command, clone_flag)) && (filterC->hasDestFilters)) {
                    // duplicate non cloning destination filters are not allowed
                    ActionMessage err(CMD_ERROR);
                    err.dest_id = command.source_id;
                    err.setSource(command.getDest());
                    err.messageID = defs::Errors::REGISTRATION_FAILURE;
                    err.payload =
                        "Endpoint " + endhandle->key + " already has a destination filter";
                    mSendMessageMove(std::move(err));
                    return;
                }
            }
            auto* newFilter = getFilterInfo(command.getSource());
            if (newFilter == nullptr) {
                newFilter = createFilter(GlobalBrokerId(command.source_id),
                                         command.source_handle,
                                         std::string(command.payload.to_string()),
                                         command.getString(typeStringLoc),
                                         command.getString(typeOutStringLoc),
                                         checkActionFlag(command, clone_flag));
            }

            filterC->hasDestFilters = true;
            if (checkActionFlag(command, clone_flag)) {
                filterC->cloningDestFilters.push_back(newFilter);
            } else {
                if (endhandle != nullptr) {
                    setActionFlag(*endhandle, has_non_cloning_dest_filter_flag);
                }
                filterC->destFilter = newFilter;
            }
        }
    } else {
        for (auto& filt : filterC->allSourceFilters) {
            if ((filt->core_id == command.source_id) && (filt->handle == command.source_handle)) {
                FilterAlreadyPresent = true;
                break;
            }
        }
        if (!FilterAlreadyPresent) {
            auto* newFilter = getFilterInfo(command.getSource());
            if (newFilter == nullptr) {
                newFilter = createFilter(GlobalBrokerId(command.source_id),
                                         command.source_handle,
                                         std::string(command.payload.to_string()),
                                         command.getString(typeStringLoc),
                                         command.getString(typeOutStringLoc),
                                         checkActionFlag(command, clone_flag));
            }
            filterC->allSourceFilters.push_back(newFilter);
            filterC->hasSourceFilters = true;
            auto* endhandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
            if (endhandle != nullptr) {
                setActionFlag(*endhandle, has_source_filter_flag);
            }
        }
    }
}